

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_mthd_misc.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdNop::adjust_orig_mthd(MthdNop *this)

{
  bool bVar1;
  result_type rVar2;
  MthdNop *this_local;
  
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest
                        .super_Test.rnd);
  if ((rVar2 & 1) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.val =
         (this->super_SingleMthdTest).super_MthdTest.val & 0xf;
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar2 & 1) != 0) {
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      (this->super_SingleMthdTest).super_MthdTest.val =
           1 << ((byte)rVar2 & 0x1f) ^ (this->super_SingleMthdTest).super_MthdTest.val;
    }
  }
  if (0xf < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
            chipset.card_type) {
    (this->super_SingleMthdTest).super_MthdTest.val =
         (this->super_SingleMthdTest).super_MthdTest.val & 0xfffffffd;
  }
  bVar1 = nv04_pgraph_is_nv15p
                    (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
                      super_Test.chipset);
  if ((bVar1) &&
     (((((((this->super_SingleMthdTest).super_MthdTest.cls == 0x5f ||
          ((this->super_SingleMthdTest).super_MthdTest.cls == 0x9f)) ||
         ((this->super_SingleMthdTest).super_MthdTest.cls == 0x54)) ||
        (((this->super_SingleMthdTest).super_MthdTest.cls == 0x94 ||
         ((this->super_SingleMthdTest).super_MthdTest.cls == 0x55)))) ||
       (((this->super_SingleMthdTest).super_MthdTest.cls == 0x95 ||
        (((this->super_SingleMthdTest).super_MthdTest.cls == 0x56 ||
         ((this->super_SingleMthdTest).super_MthdTest.cls == 0x96)))))) ||
      (((this->super_SingleMthdTest).super_MthdTest.cls == 0x98 ||
       ((this->super_SingleMthdTest).super_MthdTest.cls == 0x99)))))) {
    (this->super_SingleMthdTest).super_MthdTest.val =
         (this->super_SingleMthdTest).super_MthdTest.val & 0xfffffffb;
  }
  return;
}

Assistant:

void MthdNop::adjust_orig_mthd() {
	if (rnd() & 1) {
		val &= 0xf;
		if (rnd() & 1)
			val ^= 1 << (rnd() & 0x1f);
	}
	// XXX: this triggers DMA
	if (chipset.card_type >= 0x10)
		val &= ~2;
	// XXX: figure this out
	if (nv04_pgraph_is_nv15p(&chipset) &&
		(cls == 0x5f || cls == 0x9f || cls == 0x54 || cls == 0x94 || cls == 0x55 || cls == 0x95 ||
		 cls == 0x56 || cls == 0x96 || cls == 0x98 || cls == 0x99))
		val &= ~4;
}